

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_source_context_field
          (OneofWellKnownTypes *this,SourceContext *source_context_field)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  SourceContext *source_context_field_local;
  OneofWellKnownTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_oneof_field(this);
  if (source_context_field != (SourceContext *)0x0) {
    submessage_arena_00 =
         google::protobuf::MessageLite::GetArena((MessageLite *)source_context_field);
    message_arena = (Arena *)source_context_field;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<google::protobuf::SourceContext>
                              (message_arena_00,source_context_field,submessage_arena_00);
    }
    set_has_source_context_field(this);
    (this->field_0)._impl_.oneof_field_.any_field_ = (Message *)message_arena;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_source_context_field(::google::protobuf::SourceContext* PROTOBUF_NULLABLE source_context_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (source_context_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(source_context_field)->GetArena();
    if (message_arena != submessage_arena) {
      source_context_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, source_context_field, submessage_arena);
    }
    set_has_source_context_field();
    _impl_.oneof_field_.source_context_field_ = source_context_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.source_context_field)
}